

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_encode.cpp
# Opt level: O1

void swizzle_to_rgba(uint8_t *rgbadst,uint8_t *rgbasrc,uint32_t src_len,ktx_size_t image_size,
                    swizzle_e *swizzle)

{
  ulong uVar1;
  long lVar2;
  uint8_t uVar3;
  
  if (image_size != 0) {
    uVar1 = 0;
    do {
      lVar2 = 0;
      do {
        switch(swizzle[lVar2]) {
        case R:
          uVar3 = *rgbasrc;
          break;
        case G:
          uVar3 = rgbasrc[1];
          break;
        case B:
          uVar3 = rgbasrc[2];
          break;
        case A:
          uVar3 = rgbasrc[3];
          break;
        case ZERO:
          uVar3 = '\0';
          break;
        case ONE:
          uVar3 = 0xff;
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_encode.cpp"
                        ,0x7d,
                        "void swizzle_to_rgba(uint8_t *, uint8_t *, uint32_t, ktx_size_t, swizzle_e *)"
                       );
        }
        rgbadst[lVar2] = uVar3;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      rgbadst = rgbadst + 4;
      rgbasrc = rgbasrc + src_len;
      uVar1 = uVar1 + src_len;
    } while (uVar1 < image_size);
  }
  return;
}

Assistant:

void
swizzle_to_rgba(uint8_t* rgbadst, uint8_t* rgbasrc, uint32_t src_len,
                ktx_size_t image_size, swizzle_e swizzle[4])
{
    for (ktx_size_t i = 0; i < image_size; i += src_len) {
        for (uint32_t c = 0; c < 4; c++) {
            switch (swizzle[c]) {
              case R:
                rgbadst[c] = rgbasrc[0];
                break;
              case G:
                rgbadst[c] = rgbasrc[1];
                break;
              case B:
                rgbadst[c] = rgbasrc[2];
                break;
              case A:
                rgbadst[c] = rgbasrc[3];
                break;
              case ZERO:
                rgbadst[c] = 0x00;
                break;
              case ONE:
                rgbadst[c] = 0xff;
                break;
              default:
                assert(false);
            }
        }
        rgbadst +=4; rgbasrc += src_len;
    }
}